

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O0

int __thiscall SimpleLineFunctor::operator()(SimpleLineFunctor *this,VectorXd *z,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  size_type sVar5;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *pDVar6;
  CoeffReturnType pdVar7;
  CoeffReturnType pdVar8;
  Scalar *pSVar9;
  uint local_44;
  uint i;
  double b;
  double a;
  double y_i;
  double x_i;
  VectorXd *fvec_local;
  VectorXd *z_local;
  SimpleLineFunctor *this_local;
  
  local_44 = 0;
  while( true ) {
    sVar5 = std::
            vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            ::size(&this->Points);
    if (sVar5 <= local_44) break;
    pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
             std::
             vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             ::operator[](&this->Points,(ulong)local_44);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()(pDVar6,1);
    dVar1 = *pdVar7;
    pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
             std::
             vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             ::operator[](&this->Points,(ulong)local_44);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()(pDVar6,0);
    dVar2 = *pdVar7;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)z,0);
    dVar3 = *pdVar8;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)z,1);
    dVar4 = *pdVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)fvec,
                        (ulong)local_44);
    *pSVar9 = dVar1 - (dVar3 * dVar2 + dVar4);
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &fvec) const
    {
        // "a" in the model is z(0), and "b" is z(1)
        double x_i,y_i,a,b;
        for(unsigned int i = 0; i < this->Points.size(); ++i)
        {
            y_i=this->Points[i](1);
            x_i=this->Points[i](0);
            a=z(0);
            b=z(1);
            fvec(i) =y_i-(a*x_i +b);
        }

        return 0;
    }